

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMPCG.cpp
# Opt level: O1

void __thiscall phaeton::OMPCG::visitContractionExpr(OMPCG *this,ContractionExpr *ContrExpr)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer ppEVar4;
  pointer piVar5;
  pointer pcVar6;
  ExpressionNode *pEVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  long *plVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar15;
  string Index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ContrIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string Tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RHSIndices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  LHSIndices;
  string RHSTmp;
  string LHSTmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  SavedExprIndices;
  value_type local_1b8;
  string local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  ExpressionNode *local_138;
  ExpressionNode *local_130;
  string local_128;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  ExpressionNode *local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((ContrExpr->super_ExpressionNode).NumChildren != 2) {
    __assert_fail("ContrExpr->getNumChildren() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Target/OMPCG.cpp"
                  ,0x324,
                  "virtual void phaeton::OMPCG::visitContractionExpr(const ContractionExpr *)");
  }
  local_b0 = this->ResultTmp;
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  CodeGen::getTmp_abi_cxx11_(&local_108,this->CG);
  iVar12 = (ContrExpr->super_ExpressionNode).NumChildren;
  if ((0 < iVar12) && (iVar12 != 1)) {
    ppEVar4 = (ContrExpr->super_ExpressionNode).Children.
              super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_130 = *ppEVar4;
    local_138 = ppEVar4[1];
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar14 = 0;
      do {
        getIndex_abi_cxx11_(&local_198,this);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
        puVar9 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_1b8.field_2._M_allocated_capacity = *puVar9;
          local_1b8.field_2._8_8_ = plVar8[3];
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *puVar9;
          local_1b8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1b8._M_string_length = plVar8[1];
        *plVar8 = (long)puVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_178,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)(ContrExpr->LeftIndices).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(ContrExpr->LeftIndices).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2));
    }
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((local_130->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_130->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar14 = 0;
      paVar1 = &local_1b8.field_2;
      iVar12 = 0;
      do {
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity =
             local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        piVar5 = (ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        if (((ulong)(long)iVar12 <
             (ulong)((long)(ContrExpr->LeftIndices).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) &&
           (uVar14 == (uint)piVar5[iVar12])) {
          std::__cxx11::string::_M_assign((string *)&local_1b8);
          iVar12 = iVar12 + 1;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_1b8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_c8,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)(local_130->Dims).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(local_130->Dims).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2));
    }
    if ((local_138->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_138->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar14 = 0;
      paVar1 = &local_1b8.field_2;
      iVar12 = 0;
      do {
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity =
             local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        piVar5 = (ContrExpr->RightIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        if (((ulong)(long)iVar12 <
             (ulong)((long)(ContrExpr->RightIndices).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) &&
           (uVar14 == (uint)piVar5[iVar12])) {
          std::__cxx11::string::_M_assign((string *)&local_1b8);
          iVar12 = iVar12 + 1;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_1b8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_e8,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)(local_138->Dims).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(local_138->Dims).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2));
    }
    emitLoopHeaderNest(this,&(ContrExpr->super_ExpressionNode).Dims,false,true);
    paVar1 = &local_1b8.field_2;
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)this->NestLevel * '\x02');
    std::__cxx11::string::_M_append
              ((char *)&this->CG->TgtLangCode,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    pcVar6 = (this->FloatPointTypeName)._M_dataplus._M_p;
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar6,pcVar6 + (this->FloatPointTypeName)._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_158,(ulong)local_108._M_dataplus._M_p);
    paVar2 = &local_198.field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_198.field_2._M_allocated_capacity = *psVar10;
      local_198.field_2._8_8_ = plVar8[3];
      local_198._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar10;
      local_198._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_198._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8.field_2._8_8_ = plVar8[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&this->CG->TgtLangCode,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    __x = &this->ExprIndices;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__x,&local_c8);
    pEVar7 = local_130;
    visitChildExpr_abi_cxx11_(&local_1b8,this,local_130);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    emitLoopHeaderNest(this,&pEVar7->Dims,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__x,&local_e8);
    pEVar7 = local_138;
    visitChildExpr_abi_cxx11_(&local_1b8,this,local_138);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    emitLoopHeaderNest(this,&pEVar7->Dims,false,false);
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)this->NestLevel * '\x02');
    std::__cxx11::string::_M_append
              ((char *)&this->CG->TgtLangCode,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
    std::__cxx11::string::append((char *)local_68);
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)local_88);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128.field_2._8_8_ = plVar8[3];
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_128._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_128);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_148 = *plVar11;
      lStack_140 = plVar8[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar11;
      local_158 = (long *)*plVar8;
    }
    local_150 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_a8);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_198.field_2._M_allocated_capacity = *psVar10;
      local_198.field_2._8_8_ = plVar8[3];
      local_198._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar10;
      local_198._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_198._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8.field_2._8_8_ = plVar8[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&this->CG->TgtLangCode,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar14 = 0;
      do {
        uVar3 = this->NestLevel;
        this->NestLevel = uVar3 - 1;
        emitForLoopFooter(this,uVar3 * 2 - 2);
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)local_178.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)this->NestLevel * '\x02');
    std::__cxx11::string::_M_append
              ((char *)&this->CG->TgtLangCode,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    subscriptedIdentifier(&local_128,this,local_b0,&this->ResultIndices);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_128);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_148 = *plVar11;
      lStack_140 = plVar8[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar11;
      local_158 = (long *)*plVar8;
    }
    local_150 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_158,(ulong)local_108._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_198.field_2._M_allocated_capacity = *psVar10;
      local_198.field_2._8_8_ = plVar8[3];
      local_198._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar10;
      local_198._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_198._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8.field_2._8_8_ = plVar8[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&this->CG->TgtLangCode,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        pVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&(this->LoopedOverIndices)._M_t,
                               (key_type *)
                               ((long)&((local_178.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar13));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&(this->LoopedOverIndices)._M_t,(_Base_ptr)pVar15.first._M_node,
                       (_Base_ptr)pVar15.second._M_node);
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar14 < (ulong)((long)local_178.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(__x,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    return;
  }
  __assert_fail("I < getNumChildren()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/include/ph/Opt/TensorExprTree.h"
                ,0x3c,"const ExpressionNode *phaeton::ExpressionNode::getChild(int) const");
}

Assistant:

void OMPCG::visitContractionExpr(const ContractionExpr *ContrExpr) {
  assert(ContrExpr->getNumChildren() == 2);

  const ExpressionNode *Result = getResultTmp();
  std::string LHSTmp, RHSTmp;
  const std::string Tmp = getTmp();

  // Here 'LHS' and 'RHS' for contraction expression means its two operand.
  const ExpressionNode *LHSExpr = ContrExpr->getChild(0);
  const ExpressionNode *RHSExpr = ContrExpr->getChild(1);

  const std::vector<int> &ExprDims = getDims(ContrExpr);
  const std::vector<int> &LHSDims = getDims(ContrExpr->getChild(0));
  const std::vector<int> &RHSDims = getDims(ContrExpr->getChild(1));

  std::vector<std::string> ContrIndices;
  for (int I = 0; I < ContrExpr->getLeftIndices().size(); ++I) {
    const std::string &Index = getIndex() + "_contr";
    ContrIndices.push_back(Index);
  }

  std::vector<std::string> LHSIndices, RHSIndices;
  int ExprIndexCounter = 0;
  // Here we need to determine which indices belong to 'LHS', i.e. the first
  // operand.
  {
    int ContrIndexCounter = 0;
    for (int I = 0; I < LHSDims.size(); ++I) {
      std::string Index;
      if (ContrIndexCounter < ContrExpr->getLeftIndices().size() &&
          I == ContrExpr->getLeftIndices()[ContrIndexCounter]) {
        Index = ContrIndices[ContrIndexCounter++];
      } else {
        Index = ExprIndices[ExprIndexCounter++];
      }
      LHSIndices.push_back(Index);
    }
  }
  // Here we need to determine which indices belong to 'RHS', i.e. the second
  // operand.
  {
    int ContrIndexCounter = 0;
    for (int I = 0; I < RHSDims.size(); ++I) {
      std::string Index;
      if (ContrIndexCounter < ContrExpr->getRightIndices().size() &&
          I == ContrExpr->getRightIndices()[ContrIndexCounter]) {
        Index = ContrIndices[ContrIndexCounter++];
      } else {
        Index = ExprIndices[ExprIndexCounter++];
      }
      RHSIndices.push_back(Index);
    }
  }

  // Here we need to emit for loop nest for result.
  emitLoopHeaderNest(ExprDims, /*Unroll=*/false, /*Simd=*/true);

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  // FIXME: for different we need to determine the zero format for different
  // kind float point numbers.
  appendCode(getFloatPointTypeName() + " " + Tmp + " = 0.0;\n");

  const std::vector<std::string> SavedExprIndices = ExprIndices;
  // Here we visit 'LHS'.
  ExprIndices = LHSIndices;
  LHSTmp = visitChildExpr(LHSExpr);
  // Here we emit for loop nest for 'LHS' early.
  emitLoopHeaderNest(LHSDims, /*Unroll=*/false, /*Simd=*/false);
  // Here we visit 'RHS' and emit loop headers as necessary.
  ExprIndices = RHSIndices;
  RHSTmp = visitChildExpr(RHSExpr);
  // Here we emit for loop nest for 'RHS'.
  emitLoopHeaderNest(RHSDims, /*Unroll=*/false, /*Simd=*/false);

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  appendCode(Tmp + " += " + LHSTmp + " * " + RHSTmp + ";\n");

  // 1. We need to close those for loops that iterate over those contracted
  // indices.
  for (int I = 0; I < ContrIndices.size(); ++I) {
    --NestLevel;
    emitForLoopFooter(NestLevel * OMP_INDENT_PER_LEVEL);
  }

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  appendCode(subscriptedIdentifier(Result, ResultIndices) + " = " + Tmp +
             ";\n");

  // 2. Then we need to remove contracted indices from 'LoopedOverIndices'.
  for (int I = 0; I < ContrIndices.size(); ++I) {
    LoopedOverIndices.erase(ContrIndices[I]);
  }

  ExprIndices = SavedExprIndices;
}